

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O1

void api_suite::api_insert_value(void)

{
  int ******ppppppiVar1;
  int *******pppppppiVar2;
  map_array<int,_int,_4UL,_std::less<int>_> array;
  int *******local_68;
  int *******local_60;
  int ******local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int *******local_38;
  int *******local_30;
  int *******local_28;
  
  local_30 = (int *******)&local_38;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = (int ******)0x0;
  uStack_50 = 0;
  local_38 = &local_58;
  local_60 = (int *******)0x0;
  local_68 = (int *******)((ulong)local_68 & 0xffffffff00000000);
  local_28 = local_38;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x51,"void api_suite::api_insert_value()",&local_60,&local_68);
  local_60 = local_28;
  if (local_28 != local_30) {
    pppppppiVar2 = local_28 + 1;
    *local_28 = (int ******)0x10000000b;
    local_28 = pppppppiVar2;
    local_60 = local_28;
    if (local_38 != local_28) {
      while ((local_60 = local_60 + -1, local_60 != local_38 &&
             (*(int *)local_60 < *(int *)(local_60 + -1)))) {
        ppppppiVar1 = *local_60;
        *local_60 = local_60[-1];
        local_60[-1] = ppppppiVar1;
      }
    }
  }
  local_68 = local_38;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.insert({ 11, 1 })","array.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x52,"void api_suite::api_insert_value()",&local_60,&local_68);
  local_60 = (int *******)((long)local_28 - (long)local_38 >> 3);
  local_68 = (int *******)CONCAT44(local_68._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x53,"void api_suite::api_insert_value()",&local_60,&local_68);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}